

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

MetadataResult SetNullValue(ShellState *state,char **azArg,idx_t nArg)

{
  char *__s;
  char *pcVar1;
  
  __s = azArg[1];
  pcVar1 = (char *)(state->nullValue)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&state->nullValue,0,pcVar1,(ulong)__s);
  return SUCCESS;
}

Assistant:

MetadataResult SetNullValue(ShellState &state, const char **azArg, idx_t nArg) {
	state.nullValue = azArg[1];
	return MetadataResult::SUCCESS;
}